

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::c_formatter<spdlog::details::null_scoped_padder>::format
          (c_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  reference ppcVar1;
  memory_buf_t *pmVar2;
  const_reference ppcVar3;
  string_view_t view;
  string_view_t view_00;
  char local_85 [5];
  fmt_helper *local_80;
  char local_69;
  fmt_helper *local_68;
  null_scoped_padder local_51;
  undefined8 uStack_50;
  null_scoped_padder p;
  size_t field_size;
  memory_buf_t *dest_local;
  tm *tm_time_local;
  log_msg *param_1_local;
  c_formatter<spdlog::details::null_scoped_padder> *this_local;
  
  uStack_50 = 0x18;
  null_scoped_padder::null_scoped_padder(&local_51,0x18,&(this->super_flag_formatter).padinfo_,dest)
  ;
  ppcVar1 = std::array<const_char_*,_7UL>::operator[]
                      ((array<const_char_*,_7UL> *)days,(long)tm_time->tm_wday);
  local_68 = (fmt_helper *)*ppcVar1;
  pmVar2 = (memory_buf_t *)std::char_traits<char>::length((char_type *)local_68);
  view.size_ = (size_t)dest;
  view.data_ = (char *)pmVar2;
  fmt_helper::append_string_view(local_68,view,pmVar2);
  local_69 = ' ';
  fmt::v10::detail::buffer<char>::push_back(&dest->super_buffer<char>,&local_69);
  ppcVar3 = std::array<const_char_*,_12UL>::operator[]
                      ((array<const_char_*,_12UL> *)months,(long)tm_time->tm_mon);
  local_80 = (fmt_helper *)*ppcVar3;
  pmVar2 = (memory_buf_t *)std::char_traits<char>::length((char_type *)local_80);
  view_00.size_ = (size_t)dest;
  view_00.data_ = (char *)pmVar2;
  fmt_helper::append_string_view(local_80,view_00,pmVar2);
  local_85[4] = 0x20;
  fmt::v10::detail::buffer<char>::push_back(&dest->super_buffer<char>,local_85 + 4);
  fmt_helper::append_int<int>(tm_time->tm_mday,dest);
  local_85[3] = 0x20;
  fmt::v10::detail::buffer<char>::push_back(&dest->super_buffer<char>,local_85 + 3);
  fmt_helper::pad2(tm_time->tm_hour,dest);
  local_85[2] = 0x3a;
  fmt::v10::detail::buffer<char>::push_back(&dest->super_buffer<char>,local_85 + 2);
  fmt_helper::pad2(tm_time->tm_min,dest);
  local_85[1] = 0x3a;
  fmt::v10::detail::buffer<char>::push_back(&dest->super_buffer<char>,local_85 + 1);
  fmt_helper::pad2(tm_time->tm_sec,dest);
  local_85[0] = ' ';
  fmt::v10::detail::buffer<char>::push_back(&dest->super_buffer<char>,local_85);
  fmt_helper::append_int<int>(tm_time->tm_year + 0x76c,dest);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override {
        const size_t field_size = 24;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::append_string_view(days[static_cast<size_t>(tm_time.tm_wday)], dest);
        dest.push_back(' ');
        fmt_helper::append_string_view(months[static_cast<size_t>(tm_time.tm_mon)], dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_mday, dest);
        dest.push_back(' ');
        // time

        fmt_helper::pad2(tm_time.tm_hour, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_year + 1900, dest);
    }